

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.hpp
# Opt level: O3

void __thiscall cinatra::cookie::cookie(cookie *this)

{
  char *__end;
  
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)this,"","");
  (this->value_)._M_dataplus._M_p = (pointer)&(this->value_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->value_,"","");
  (this->comment_)._M_dataplus._M_p = (pointer)&(this->comment_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->comment_,"");
  (this->domain_)._M_dataplus._M_p = (pointer)&(this->domain_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->domain_,"");
  (this->priority_)._M_dataplus._M_p = (pointer)&(this->priority_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->priority_,"");
  (this->path_)._M_dataplus._M_p = (pointer)&(this->path_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->path_,"");
  this->max_age_ = -1;
  this->version_ = 0;
  this->secure_ = false;
  this->http_only_ = false;
  return;
}

Assistant:

cookie() = default;